

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

size_t Curl_multissl_version(char *buffer,size_t size)

{
  Curl_ssl *pCVar1;
  size_t sVar2;
  Curl_ssl *pCVar3;
  long lVar4;
  char *pcVar5;
  
  pCVar1 = Curl_ssl;
  if (Curl_ssl == &Curl_ssl_multi) {
    pCVar1 = available_backends[0];
  }
  if (pCVar1 != Curl_multissl_version::selected) {
    pcVar5 = Curl_multissl_version::backends;
    Curl_multissl_version::selected = pCVar1;
    if (available_backends[0] != (Curl_ssl *)0x0) {
      lVar4 = 0;
      pcVar5 = Curl_multissl_version::backends;
      pCVar3 = available_backends[0];
      do {
        if (lVar4 != 0) {
          *pcVar5 = ' ';
          pcVar5 = pcVar5 + 1;
          pCVar3 = available_backends[lVar4];
        }
        if (pCVar1 != pCVar3) {
          *pcVar5 = '(';
          pcVar5 = pcVar5 + 1;
          pCVar3 = available_backends[lVar4];
        }
        sVar2 = (*pCVar3->version)(pcVar5,(long)&Curl_multissl_version::total - (long)pcVar5);
        pCVar1 = Curl_multissl_version::selected;
        pcVar5 = pcVar5 + sVar2;
        if (Curl_multissl_version::selected != available_backends[lVar4]) {
          *pcVar5 = ')';
          pcVar5 = pcVar5 + 1;
        }
        pCVar3 = available_backends[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (pCVar3 != (Curl_ssl *)0x0);
    }
    *pcVar5 = '\0';
    Curl_multissl_version::total = (size_t)(pcVar5 + -0x5e1bf0);
  }
  sVar2 = Curl_multissl_version::total;
  if (size < Curl_multissl_version::total) {
    memcpy(buffer,Curl_multissl_version::backends,Curl_multissl_version::total + 1);
  }
  else {
    memcpy(buffer,Curl_multissl_version::backends,size - 1);
    buffer[size - 1] = '\0';
  }
  return sVar2;
}

Assistant:

static size_t Curl_multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t total;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    int i;

    selected = current;

    for(i = 0; available_backends[i]; i++) {
      if(i)
        *(p++) = ' ';
      if(selected != available_backends[i])
        *(p++) = '(';
      p += available_backends[i]->version(p, backends + sizeof(backends) - p);
      if(selected != available_backends[i])
        *(p++) = ')';
    }
    *p = '\0';
    total = p - backends;
  }

  if(size < total)
    memcpy(buffer, backends, total + 1);
  else {
    memcpy(buffer, backends, size - 1);
    buffer[size - 1] = '\0';
  }

  return total;
}